

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O0

void __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::subscriber_adaptive_container_t
          (subscriber_adaptive_container_t *this,subscriber_adaptive_container_t *o)

{
  subscriber_adaptive_container_t *o_local;
  subscriber_adaptive_container_t *this_local;
  
  this->m_storage = o->m_storage;
  std::
  vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
  ::vector(&this->m_vector,&o->m_vector);
  std::
  map<so_5::agent_t_*,_so_5::impl::local_mbox_details::subscriber_info_t,_so_5::impl::local_mbox_details::subscriber_adaptive_container_t::agent_ptr_compare_type,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  ::map(&this->m_map,&o->m_map);
  o->m_storage = vector;
  return;
}

Assistant:

subscriber_adaptive_container_t(
		subscriber_adaptive_container_t && o )
		:	m_storage{ o.m_storage }
		,	m_vector( std::move( o.m_vector ) )
		,	m_map( std::move( o.m_map ) )
		{
			// Other object is now empty.
			// It must use vector as a storage.
			o.m_storage = storage_type::vector;
		}